

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_color.hpp
# Opt level: O3

void __thiscall
optimization::graph_color::Conflict_Map::add_conflict
          (Conflict_Map *this,VarId *defVar,
          set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
          *useVars)

{
  map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
  *this_01;
  size_type sVar2;
  mapped_type *pmVar3;
  size_type sVar4;
  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  *p_Var5;
  _Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
  *p_Var6;
  _Base_ptr p_Var7;
  uint32_t uVar8;
  _Base_ptr p_Var9;
  _Rb_tree_header *p_Var10;
  VarId useVar;
  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  local_a8;
  key_type local_70;
  _Rb_tree_header *local_60;
  map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
  *local_58;
  _Rb_tree_header *local_50;
  map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
  *local_48;
  VarId *local_40;
  _Rb_tree_node_base *local_38;
  
  this_00 = &this->merged_var_Map;
  sVar2 = std::
          map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
          ::count(this_00,defVar);
  if (sVar2 != 0) {
    pmVar3 = std::
             map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
             ::at(this_00,defVar);
    defVar->id = pmVar3->id;
  }
  sVar4 = std::
          map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
          ::count(&this->static_Map,defVar);
  if (sVar4 == 0) {
    p_Var1 = &local_a8._M_impl.super__Rb_tree_header;
    local_a8._M_impl._0_8_ = 0;
    local_a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_a8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_a8._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_a8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_a8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    p_Var5 = &std::
              map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
              ::operator[](&this->static_Map,defVar)->_M_t;
    std::
    _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
    ::clear(p_Var5);
    if (local_a8._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
      (p_Var5->_M_impl).super__Rb_tree_header._M_header._M_color =
           local_a8._M_impl.super__Rb_tree_header._M_header._M_color;
      (p_Var5->_M_impl).super__Rb_tree_header._M_header._M_parent =
           local_a8._M_impl.super__Rb_tree_header._M_header._M_parent;
      (p_Var5->_M_impl).super__Rb_tree_header._M_header._M_left =
           local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
      (p_Var5->_M_impl).super__Rb_tree_header._M_header._M_right =
           local_a8._M_impl.super__Rb_tree_header._M_header._M_right;
      (local_a8._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
           &(p_Var5->_M_impl).super__Rb_tree_header._M_header;
      (p_Var5->_M_impl).super__Rb_tree_header._M_node_count =
           local_a8._M_impl.super__Rb_tree_header._M_node_count;
      local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_a8._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_a8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      local_a8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    }
    std::
    _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
    ::~_Rb_tree(&local_a8);
    local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_a8._M_impl._0_8_ = 0;
    local_a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_a8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_a8._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_a8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_a8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    p_Var5 = &std::
              map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
              ::operator[](&this->dynamic_Map,defVar)->_M_t;
    std::
    _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
    ::clear(p_Var5);
    if (local_a8._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
      (p_Var5->_M_impl).super__Rb_tree_header._M_header._M_color =
           local_a8._M_impl.super__Rb_tree_header._M_header._M_color;
      (p_Var5->_M_impl).super__Rb_tree_header._M_header._M_parent =
           local_a8._M_impl.super__Rb_tree_header._M_header._M_parent;
      (p_Var5->_M_impl).super__Rb_tree_header._M_header._M_left =
           local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
      (p_Var5->_M_impl).super__Rb_tree_header._M_header._M_right =
           local_a8._M_impl.super__Rb_tree_header._M_header._M_right;
      (local_a8._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
           &(p_Var5->_M_impl).super__Rb_tree_header._M_header;
      (p_Var5->_M_impl).super__Rb_tree_header._M_node_count =
           local_a8._M_impl.super__Rb_tree_header._M_node_count;
      local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_a8._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_a8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      local_a8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    }
    std::
    _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
    ::~_Rb_tree(&local_a8);
  }
  p_Var7 = (useVars->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_38 = &(useVars->_M_t)._M_impl.super__Rb_tree_header._M_header;
  if (p_Var7 != local_38) {
    local_50 = &(this->merged_var_Map)._M_t._M_impl.super__Rb_tree_header;
    local_60 = &(this->static_Map)._M_t._M_impl.super__Rb_tree_header;
    p_Var1 = &local_a8._M_impl.super__Rb_tree_header;
    local_58 = &this->dynamic_Map;
    local_48 = this_00;
    local_40 = defVar;
    do {
      local_70.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
      local_70.id = *(uint32_t *)&p_Var7[1]._M_parent;
      p_Var9 = (this->merged_var_Map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var10 = local_50;
      if (p_Var9 != (_Base_ptr)0x0) {
        do {
          if (*(uint *)((long)(p_Var9 + 1) + 8) >= local_70.id) {
            p_Var10 = (_Rb_tree_header *)p_Var9;
          }
          p_Var9 = (&p_Var9->_M_left)[*(uint *)((long)(p_Var9 + 1) + 8) < local_70.id];
        } while (p_Var9 != (_Base_ptr)0x0);
        if ((p_Var10 != local_50) && (*(uint *)(p_Var10 + 1) <= local_70.id)) {
          pmVar3 = std::
                   map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                   ::at(local_48,&local_70);
          local_70.id = pmVar3->id;
        }
      }
      uVar8 = defVar->id;
      if (((uVar8 == 0x1020b) && (local_70.id == 0x1020d)) ||
         ((uVar8 == 0x1020d && (local_70.id == 0x1020b)))) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"find it ",8);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
        std::ostream::put(-0x18);
        std::ostream::flush();
        uVar8 = defVar->id;
      }
      if (uVar8 != local_70.id) {
        p_Var9 = (this->static_Map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var10 = local_60;
        if (p_Var9 == (_Base_ptr)0x0) {
LAB_001403f5:
          local_a8._M_impl._0_8_ = 0;
          local_a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_a8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
          local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_a8._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_a8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
          local_a8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
          p_Var5 = &std::
                    map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                    ::operator[](&this->static_Map,&local_70)->_M_t;
          std::
          _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
          ::clear(p_Var5);
          if (local_a8._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
            (p_Var5->_M_impl).super__Rb_tree_header._M_header._M_color =
                 local_a8._M_impl.super__Rb_tree_header._M_header._M_color;
            (p_Var5->_M_impl).super__Rb_tree_header._M_header._M_parent =
                 local_a8._M_impl.super__Rb_tree_header._M_header._M_parent;
            (p_Var5->_M_impl).super__Rb_tree_header._M_header._M_left =
                 local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
            (p_Var5->_M_impl).super__Rb_tree_header._M_header._M_right =
                 local_a8._M_impl.super__Rb_tree_header._M_header._M_right;
            (local_a8._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
                 &(p_Var5->_M_impl).super__Rb_tree_header._M_header;
            (p_Var5->_M_impl).super__Rb_tree_header._M_node_count =
                 local_a8._M_impl.super__Rb_tree_header._M_node_count;
            local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_a8._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_a8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
            local_a8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
          }
          std::
          _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
          ::~_Rb_tree(&local_a8);
          local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_a8._M_impl._0_8_ = 0;
          local_a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_a8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
          local_a8._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_a8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
          local_a8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
          p_Var5 = &std::
                    map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                    ::operator[](local_58,&local_70)->_M_t;
          std::
          _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
          ::clear(p_Var5);
          if (local_a8._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
            (p_Var5->_M_impl).super__Rb_tree_header._M_header._M_color =
                 local_a8._M_impl.super__Rb_tree_header._M_header._M_color;
            (p_Var5->_M_impl).super__Rb_tree_header._M_header._M_parent =
                 local_a8._M_impl.super__Rb_tree_header._M_header._M_parent;
            (p_Var5->_M_impl).super__Rb_tree_header._M_header._M_left =
                 local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
            (p_Var5->_M_impl).super__Rb_tree_header._M_header._M_right =
                 local_a8._M_impl.super__Rb_tree_header._M_header._M_right;
            (local_a8._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
                 &(p_Var5->_M_impl).super__Rb_tree_header._M_header;
            (p_Var5->_M_impl).super__Rb_tree_header._M_node_count =
                 local_a8._M_impl.super__Rb_tree_header._M_node_count;
            local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_a8._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_a8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
            local_a8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
          }
          std::
          _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
          ::~_Rb_tree(&local_a8);
          defVar = local_40;
        }
        else {
          do {
            if (*(uint *)((long)(p_Var9 + 1) + 8) >= local_70.id) {
              p_Var10 = (_Rb_tree_header *)p_Var9;
            }
            p_Var9 = (&p_Var9->_M_left)[*(uint *)((long)(p_Var9 + 1) + 8) < local_70.id];
          } while (p_Var9 != (_Base_ptr)0x0);
          if ((p_Var10 == local_60) || (local_70.id < *(uint *)(p_Var10 + 1))) goto LAB_001403f5;
        }
        p_Var6 = (_Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
                  *)std::
                    map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                    ::operator[](&this->static_Map,defVar);
        std::
        _Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
        ::_M_insert_unique<mir::inst::VarId_const&>(p_Var6,&local_70);
        p_Var6 = (_Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
                  *)std::
                    map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                    ::operator[](&this->static_Map,&local_70);
        std::
        _Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
        ::_M_insert_unique<mir::inst::VarId_const&>(p_Var6,defVar);
        this_01 = local_58;
        p_Var6 = (_Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
                  *)std::
                    map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                    ::operator[](local_58,defVar);
        std::
        _Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
        ::_M_insert_unique<mir::inst::VarId_const&>(p_Var6,&local_70);
        p_Var6 = (_Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
                  *)std::
                    map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                    ::operator[](this_01,&local_70);
        std::
        _Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
        ::_M_insert_unique<mir::inst::VarId_const&>(p_Var6,defVar);
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while (p_Var7 != local_38);
  }
  return;
}

Assistant:

void add_conflict(mir::inst::VarId defVar,
                    std::set<mir::inst::VarId> useVars) {
    if (merged_var_Map.count(defVar)) {
      defVar = merged_var_Map.at(defVar);
    }
    if (!static_Map.count(defVar)) {
      static_Map[defVar] = std::set<mir::inst::VarId>();
      dynamic_Map[defVar] = std::set<mir::inst::VarId>();
    }
    for (auto useVar : useVars) {
      if (merged_var_Map.count(useVar)) {
        useVar = merged_var_Map.at(useVar);
      }
      if (defVar.id == 66059 && useVar.id == 66061 ||
          useVar.id == 66059 && defVar.id == 66061) {
        std::cout << "find it " << std::endl;
      }
      if (defVar == useVar) {
        continue;
      }
      if (!static_Map.count(useVar)) {
        static_Map[useVar] = std::set<mir::inst::VarId>();
        dynamic_Map[useVar] = std::set<mir::inst::VarId>();
      }
      static_Map[defVar].insert(useVar);
      static_Map[useVar].insert(defVar);
      dynamic_Map[defVar].insert(useVar);
      dynamic_Map[useVar].insert(defVar);
    }
  }